

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

Layer * ncnn::ConvolutionDepthWise_layer_creator(void)

{
  ConvolutionDepthWise *this;
  
  this = (ConvolutionDepthWise *)operator_new(0x278);
  ConvolutionDepthWise::ConvolutionDepthWise(this);
  return &this->super_Layer;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;

    use_int8_requantize = false;
}